

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

int __thiscall CGL::CameraApertureTexture::init(CameraApertureTexture *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  char *in_RDX;
  int y;
  uint uVar10;
  uint uVar11;
  _Self __tmp;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uchar curr_texel;
  uint width;
  uint height;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texels;
  set<float,_std::greater<float>,_std::allocator<float>_> unique;
  string absolute_path;
  
  this->width = 0;
  this->height = 0;
  resolve_path_abi_cxx11_(&absolute_path,*(CGL **)ctx,in_RDX);
  texels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = lodepng::decode(&texels,&width,&height,&absolute_path,LCT_RGBA,8);
  if (uVar6 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Loaded Aperture Function with (W, H): (");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,")\n");
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"UNABLE TO LOAD APERTURE FUNCTION");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  this->width = (ulong)width;
  this->height = (ulong)height;
  std::vector<float,_std::allocator<float>_>::reserve(&this->aperture,(ulong)(height * width));
  poVar8 = std::operator<<((ostream *)&std::cout,"Number of Pixels to Process: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  this->min_y = width;
  this->min_x = width;
  this->max_x = -1;
  this->max_y = -1;
  this->total_value = 0.0;
  uVar6 = width;
  for (uVar10 = 0; uVar10 < height; uVar10 = uVar10 + 1) {
    for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 1) {
      curr_texel = texels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[(uVar6 * uVar10 + uVar11) * 4];
      Color::Color((Color *)&unique,&curr_texel);
      std::vector<float,_std::allocator<float>_>::push_back
                (&this->aperture,(value_type_conflict2 *)&unique);
      this->total_value = (double)(float)unique._M_t._M_impl._0_4_ + this->total_value;
      if (0.0 < (float)unique._M_t._M_impl._0_4_) {
        uVar1 = this->min_x;
        uVar3 = this->min_y;
        auVar12._4_4_ = uVar3;
        auVar12._0_4_ = uVar1;
        auVar5 = vpinsrd_avx(ZEXT416(uVar11),uVar10,1);
        auVar12._8_8_ = 0;
        auVar12 = vpminsd_avx(auVar12,auVar5);
        uVar2 = this->max_x;
        uVar4 = this->max_y;
        auVar13._4_4_ = uVar4;
        auVar13._0_4_ = uVar2;
        auVar13._8_8_ = 0;
        auVar5 = vpmaxsd_avx(auVar5,auVar13);
        auVar5 = vpunpcklqdq_avx(auVar12,auVar5);
        this->min_x = auVar5._0_4_;
        this->min_y = auVar5._4_4_;
        this->max_x = auVar5._8_4_;
        this->max_y = auVar5._12_4_;
      }
      uVar6 = width;
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"Bounding Box (x1,y1) - (x2,y2): (");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->min_x);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->min_y);
  poVar8 = std::operator<<(poVar8,") - (");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->max_x);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->max_y);
  std::operator<<(poVar8,")\n");
  std::set<float,std::greater<float>,std::allocator<float>>::
  set<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((set<float,std::greater<float>,std::allocator<float>> *)&unique,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  for (p_Var9 = unique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &unique._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Found unique value: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)p_Var9[1]._M_color);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::greater<float>,_std::allocator<float>_>::
  ~_Rb_tree(&unique._M_t);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&texels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  iVar7 = std::__cxx11::string::~string((string *)&absolute_path);
  return iVar7;
}

Assistant:

void init(std::string aperture_filename) {
      width = 0;
      height = 0;

      /*
       * Process the pixels, capture values (need to experiment with the values it should take)
       */
      const char* file = aperture_filename.c_str();
      string absolute_path = resolve_path(file);

      vector<unsigned char> texels;
      unsigned int width, height;

      int response = lodepng::decode(texels, width, height, absolute_path);
      if (response) {
        cout << "UNABLE TO LOAD APERTURE FUNCTION" << endl;
      } else {
        cout << "Loaded Aperture Function with (W, H): (" << width << ", " << height << ")\n";
      }

      this->width = width;
      this->height = height;
      aperture.reserve(width * height);

      // Only Capture the Red Channel (Aperture Function is in Grayscale)
      cout << "Number of Pixels to Process: " << texels.size() << endl;

      // Channel = 0
      min_x = min_y = width;
      max_x = max_y = -1;
      total_value = 0.0;
      for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
          unsigned char curr_texel = texels[4 * (y * width + x)];
          Color curr_color = Color(&curr_texel);
          aperture.push_back(curr_color.r);
          total_value += curr_color.r;

          if (curr_color.r > 0) {
            min_x = min(x, min_x);
            min_y = min(y, min_y);

            max_x = max(x, max_x);
            max_y = max(y, max_y);
          }
        }
      }

      cout << "Bounding Box (x1,y1) - (x2,y2): (" << min_x << ", " << min_y
        << ") - (" << max_x << ", " << max_y << ")\n";

      // Debug Stuff
      set<float, greater<float>> unique(aperture.begin(), aperture.end());
      for (auto uitr = unique.begin(); uitr != unique.end(); uitr++) {
        cout << "Found unique value: " << *uitr << endl;
      }

    }